

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleBot.h
# Opt level: O2

void __thiscall ExampleBot::ExampleBot(ExampleBot *this,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  Player::Player(&this->super_Player,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR_nextRound_0010ed78;
  return;
}

Assistant:

ExampleBot(std::string name = "noName") : Player(name) {}